

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall geometrycentral::surface::SurfaceMesh::compress(SurfaceMesh *this)

{
  bool bVar1;
  SurfaceMesh *in_RDI;
  SurfaceMesh *in_stack_000000a0;
  SurfaceMesh *in_stack_000000e0;
  SurfaceMesh *in_stack_000000f0;
  SurfaceMesh *in_stack_00000220;
  
  bVar1 = isCompressed(in_RDI);
  if (!bVar1) {
    compressHalfedges(in_stack_00000220);
    compressEdges(in_stack_000000a0);
    compressFaces(in_stack_000000f0);
    compressVertices(in_stack_000000e0);
    in_RDI->isCompressedFlag = true;
  }
  return;
}

Assistant:

void SurfaceMesh::compress() {
  if (isCompressed()) {
    return;
  }

  compressHalfedges();
  compressEdges();
  compressFaces();
  compressVertices();
  isCompressedFlag = true;
}